

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem.hpp
# Opt level: O1

int __thiscall baryonyx::problem::coefficient_type(problem *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  
  iVar1 = coefficient_type<std::vector<baryonyx::constraint,std::allocator<baryonyx::constraint>>>
                    (&this->equal_constraints);
  iVar2 = coefficient_type<std::vector<baryonyx::constraint,std::allocator<baryonyx::constraint>>>
                    (&this->less_constraints);
  iVar3 = coefficient_type<std::vector<baryonyx::constraint,std::allocator<baryonyx::constraint>>>
                    (&this->greater_constraints);
  if (iVar3 < iVar2) {
    iVar3 = iVar2;
  }
  if (iVar3 < iVar1) {
    iVar3 = iVar1;
  }
  return iVar3;
}

Assistant:

int coefficient_type() noexcept
    {
        int eq = coefficient_type(equal_constraints);
        int le = coefficient_type(less_constraints);
        int ge = coefficient_type(greater_constraints);

        return std::max(eq, std::max(le, ge));
    }